

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O3

void __thiscall icu_63::MeasureUnit::initCurrency(MeasureUnit *this,char *isoCurrency)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = 0;
  iVar6 = 0x14;
  do {
    while( true ) {
      if (iVar6 <= iVar4) {
        iVar3 = -1;
        goto LAB_002544d3;
      }
      iVar3 = (iVar4 + iVar6) / 2;
      iVar1 = strcmp(*(char **)(gTypes + (long)iVar3 * 8),"currency");
      if (-1 < iVar1) break;
      iVar4 = iVar3 + 1;
    }
    iVar6 = iVar3;
  } while (iVar1 != 0);
LAB_002544d3:
  this->fTypeId = iVar3;
  iVar4 = (&gOffsets)[iVar3];
  iVar6 = iVar4;
  iVar3 = *(int *)(&DAT_00300684 + (long)iVar3 * 4);
  do {
    while( true ) {
      if (iVar3 <= iVar6) goto LAB_00254539;
      iVar1 = iVar3 + iVar6;
      iVar5 = iVar1 / 2;
      iVar2 = strcmp(*(char **)(gSubTypes + (long)iVar5 * 8),isoCurrency);
      if (-1 < iVar2) break;
      iVar6 = iVar5 + 1;
    }
    iVar3 = iVar5;
  } while (iVar2 != 0);
  if (iVar1 + 3U < 2) {
LAB_00254539:
    strncpy(this->fCurrency,isoCurrency,4);
    this->fCurrency[3] = '\0';
  }
  else {
    this->fSubTypeId = iVar5 - iVar4;
  }
  return;
}

Assistant:

void MeasureUnit::initCurrency(const char *isoCurrency) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "currency");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(
            gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], isoCurrency);
    if (result != -1) {
        fSubTypeId = result - gOffsets[fTypeId];
    } else {
        uprv_strncpy(fCurrency, isoCurrency, UPRV_LENGTHOF(fCurrency));
        fCurrency[3] = 0;
    }
}